

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

int ebur128_set_max_window(ebur128_state *st,unsigned_long window)

{
  ebur128_state_internal *peVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *__s;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar8 = 3000;
  if (2999 < window || (~st->mode & 3U) != 0) {
    uVar8 = 400;
    if (400 < window) {
      uVar8 = window;
    }
    if ((st->mode & 1U) == 0) {
      uVar8 = window;
    }
  }
  peVar1 = st->d;
  iVar9 = 4;
  if ((uVar8 != peVar1->window) &&
     (((uVar6 = st->samplerate, uVar6 == 0 || ((uVar6 | uVar8) >> 0x20 == 0)) ||
      (auVar3._8_8_ = 0, auVar3._0_8_ = uVar6, auVar5._8_8_ = 0, auVar5._0_8_ = uVar8, iVar9 = 1,
      SUB168(auVar3 * auVar5,8) == 0)))) {
    uVar6 = uVar6 * uVar8;
    uVar2 = peVar1->samples_in_100ms;
    iVar9 = 1;
    if (!CARRY8(uVar2,uVar6)) {
      uVar10 = (uVar2 + uVar6) - uVar6 % uVar2;
      if (uVar6 % uVar2 == 0) {
        uVar10 = uVar6;
      }
      uVar6 = (ulong)st->channels * 8;
      if (((uVar10 == 0) || ((uVar6 | uVar10) >> 0x20 == 0)) ||
         (auVar4._8_8_ = 0, auVar4._0_8_ = uVar10,
         SUB168(auVar4 * ZEXT416(st->channels) * (undefined1  [16])0x8,8) == 0)) {
        __s = (double *)malloc(uVar6 * uVar10);
        if (__s != (double *)0x0) {
          peVar1->window = uVar8;
          free(peVar1->audio_data);
          peVar1 = st->d;
          peVar1->audio_data = __s;
          peVar1->audio_data_frames = uVar10;
          lVar7 = st->channels * uVar10;
          if (lVar7 != 0) {
            memset(__s,0,lVar7 * 8);
          }
          peVar1->needed_frames = peVar1->samples_in_100ms << 2;
          iVar9 = 0;
          peVar1->audio_data_index = 0;
          peVar1->short_term_frame_counter = 0;
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int ebur128_set_max_window(ebur128_state* st, unsigned long window) {
  int errcode = EBUR128_SUCCESS;
  size_t j;

  if ((st->mode & EBUR128_MODE_S) == EBUR128_MODE_S && window < 3000) {
    window = 3000;
  } else if ((st->mode & EBUR128_MODE_M) == EBUR128_MODE_M && window < 400) {
    window = 400;
  }

  if (window == st->d->window) {
    return EBUR128_ERROR_NO_CHANGE;
  }

  size_t new_audio_data_frames;
  if (safe_size_mul(st->samplerate, window, &new_audio_data_frames) != 0 ||
      new_audio_data_frames > ((size_t) -1) - st->d->samples_in_100ms) {
    return EBUR128_ERROR_NOMEM;
  }
  if (new_audio_data_frames % st->d->samples_in_100ms) {
    /* round up to multiple of samples_in_100ms */
    new_audio_data_frames = (new_audio_data_frames + st->d->samples_in_100ms) -
                            (new_audio_data_frames % st->d->samples_in_100ms);
  }

  size_t new_audio_data_size;
  if (safe_size_mul(new_audio_data_frames, st->channels * sizeof(double),
                    &new_audio_data_size) != 0) {
    return EBUR128_ERROR_NOMEM;
  }

  double* new_audio_data = (double*) malloc(new_audio_data_size);
  CHECK_ERROR(!new_audio_data, EBUR128_ERROR_NOMEM, exit)

  st->d->window = window;
  free(st->d->audio_data);
  st->d->audio_data = new_audio_data;
  st->d->audio_data_frames = new_audio_data_frames;
  for (j = 0; j < st->d->audio_data_frames * st->channels; ++j) {
    st->d->audio_data[j] = 0.0;
  }

  /* the first block needs 400ms of audio data */
  st->d->needed_frames = st->d->samples_in_100ms * 4;
  /* start at the beginning of the buffer */
  st->d->audio_data_index = 0;
  /* reset short term frame counter */
  st->d->short_term_frame_counter = 0;

exit:
  return errcode;
}